

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  FILEPROTO *pFVar1;
  FILEPROTO *file;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  if (pFVar1 != (FILEPROTO *)0x0) {
    (*Curl_cfree)(pFVar1->freepath);
    pFVar1->freepath = (char *)0x0;
    pFVar1->path = (char *)0x0;
    if (pFVar1->fd != -1) {
      close(pFVar1->fd);
    }
    pFVar1->fd = -1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode file_done(struct Curl_easy *data,
                          CURLcode status, bool premature)
{
  struct FILEPROTO *file = data->req.p.file;
  (void)status; /* not used */
  (void)premature; /* not used */

  if(file) {
    Curl_safefree(file->freepath);
    file->path = NULL;
    if(file->fd != -1)
      close(file->fd);
    file->fd = -1;
  }

  return CURLE_OK;
}